

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

bool BinaryenMemoryIsShared(BinaryenModuleRef module,char *name)

{
  char *pcVar1;
  IString *this;
  Memory *pMVar2;
  Fatal *this_00;
  undefined1 in_CL;
  string_view sVar3;
  undefined1 local_1a8 [392];
  char *local_20;
  char *name_local;
  
  local_20 = name;
  if (name == (char *)0x0) {
    local_20 = *(char **)((long)(((module->memories).
                                  super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                ._M_t + 8);
  }
  pcVar1 = local_20;
  this = (IString *)strlen(local_20);
  sVar3._M_str = (char *)0x0;
  sVar3._M_len = (size_t)pcVar1;
  sVar3 = wasm::IString::interned(this,sVar3,(bool)in_CL);
  pMVar2 = wasm::Module::getMemoryOrNull(module,(Name)sVar3);
  if (pMVar2 != (Memory *)0x0) {
    return pMVar2->shared;
  }
  wasm::Fatal::Fatal((Fatal *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1a8 + 0x10),"invalid memory \'",0x10);
  this_00 = wasm::Fatal::operator<<((Fatal *)local_1a8,&local_20);
  wasm::Fatal::operator<<(this_00,(char (*) [3])"\'.");
  wasm::Fatal::~Fatal((Fatal *)local_1a8);
}

Assistant:

bool BinaryenMemoryIsShared(BinaryenModuleRef module, const char* name) {
  // Maintaining compatibility for instructions with a single memory
  if (name == nullptr && module->memories.size() == 1) {
    name = module->memories[0]->name.str.data();
  }
  auto* memory = ((Module*)module)->getMemoryOrNull(name);
  if (memory == nullptr) {
    Fatal() << "invalid memory '" << name << "'.";
  }
  return memory->shared;
}